

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

void __thiscall Arbiter_Time_Test::~Arbiter_Time_Test(Arbiter_Time_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Arbiter, Time)
{
    Time a;
    Time b(a.str());

    EXPECT_EQ(a.str(), b.str());
    EXPECT_EQ(a - b, 0);

    Time x("2016-03-18T03:14:42Z");
    Time y("2016-03-18T04:24:54Z");
    const int64_t delta(1 * 60 * 60 + 10 * 60 + 12);

    EXPECT_EQ(y - x, delta);
    EXPECT_EQ(x - y, -delta);

    Time epoch("1970-01-01T00:00:00Z");
    EXPECT_EQ(epoch.asUnix(), 0);

    // Issue 23.
    {
        Time t("2019-01-03T17:39:11Z");
        EXPECT_EQ(t.asUnix() - 1546537151, 0);
    }
}